

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderInvarianceRule7Test::verifyResultData
          (TessellationShaderInvarianceRule7Test *this,void **all_iterations_data)

{
  ostringstream *poVar1;
  void *pvVar2;
  TessellationShaderInvarianceRule7Test *this_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  MessageBuilder *this_01;
  TestError *this_02;
  int iVar9;
  byte bVar10;
  byte bVar11;
  _tessellation_primitive_mode primitive_mode;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float *base_triangle_vertex3;
  float *base_triangle_vertex2;
  float *base_triangle_vertex1;
  vector<int,_std::allocator<int>_> ref_iteration_indices;
  char *primitive_mode_str;
  vector<const_float_*,_std::allocator<const_float_*>_> outer_edge_vertices;
  float *local_260;
  float *local_258;
  float *local_250;
  float *local_248;
  uint local_240;
  _tessellation_primitive_mode local_23c;
  TessellationShaderInvarianceRule7Test *local_238;
  ulong local_230;
  vector<int,_std::allocator<int>_> local_228;
  ulong local_210;
  int *local_208;
  ulong local_200;
  long local_1f8;
  long local_1f0;
  void **local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  void *local_1d0;
  ulong local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [8];
  iterator iStack_1b0;
  float **local_1a8;
  ios_base local_140 [272];
  
  local_230 = 0;
  local_238 = this;
  local_1e8 = all_iterations_data;
  do {
    if ((int)local_230 == 0) {
      local_240 = 3;
      local_1f8 = 0x2e0;
      local_23c = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
      local_210 = 0;
    }
    else {
      local_210 = (ulong)(uint)((int)((ulong)((long)(this->m_test_triangles_iterations).
                                                                                                        
                                                  super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->m_test_triangles_iterations).
                                                                                                      
                                                  super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                               -0x45d1745d);
      local_240 = 4;
      local_23c = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
      local_1f8 = 0x2f8;
    }
    lVar13 = *(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                              super_TestCase.super_TestNode._vptr_TestNode + local_1f8);
    if (*(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                         super_TestCase.super_TestNode.m_testCtx + local_1f8) != lVar13) {
      local_1d8 = (ulong)-local_240;
      local_200 = 0;
      do {
        uVar12 = local_230;
        this_00 = local_238;
        local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        if (*(char *)(lVar13 + 0x20 + local_200 * 0x2c) == '\x01') {
          pfVar14 = (float *)(lVar13 + local_200 * 0x2c);
          iVar9 = 1;
          do {
            uVar6 = getTestIterationIndex
                              (this_00,(int)uVar12 == 0,pfVar14,pfVar14 + 2,
                               (_tessellation_shader_vertex_ordering)pfVar14[7],
                               (uint)((int)pfVar14[9] + iVar9) % local_240);
            local_1b8._0_4_ = uVar6;
            if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_228,
                         (iterator)
                         local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)local_1b8);
            }
            else {
              *local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar6;
              local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar7 = (int)local_1d8 + iVar9;
            iVar9 = iVar9 + 1;
          } while (iVar7 != 0);
          local_208 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_1e0 = (ulong)(uint)((int)local_210 + (int)local_200);
            primitive_mode = local_23c;
            local_250 = pfVar14;
            do {
              if (2 < (uint)pfVar14[10]) {
                local_1d0 = local_1e8[local_1e0];
                pvVar2 = local_1e8[(uint)((int)local_210 + *local_208)];
                local_1f0 = (long)*local_208 * 0x2c +
                            *(long *)((long)&(local_238->super_TessellationShaderInvarianceBaseTest)
                                             .super_TestCaseBase.super_TestCase.super_TestNode.
                                             _vptr_TestNode + local_1f8);
                uVar12 = 0;
                do {
                  uVar8 = (ulong)(uint)((int)uVar12 * 9);
                  pfVar14 = (float *)((long)local_1d0 + uVar8 * 4);
                  local_258 = (float *)((long)local_1d0 + uVar8 * 4 + 0xc);
                  local_260 = (float *)((long)local_1d0 + uVar8 * 4 + 0x18);
                  local_248 = pfVar14;
                  bVar3 = TessellationShaderUtils::isOuterEdgeVertex(primitive_mode,pfVar14);
                  local_1c8 = uVar12;
                  bVar4 = TessellationShaderUtils::isOuterEdgeVertex(primitive_mode,local_258);
                  bVar5 = TessellationShaderUtils::isOuterEdgeVertex(primitive_mode,local_260);
                  if (bVar5 || (char)(bVar4 + bVar3) != '\0') {
                    if ((int)local_230 == 0) {
                      if (((!bVar3) || ((*local_248 == 0.0 && (!NAN(*local_248))))) &&
                         ((!bVar4 || ((*local_258 == 0.0 && (!NAN(*local_258))))))) {
                        uVar6 = 0;
                        if ((!bVar5) || ((*local_260 == 0.0 && (uVar6 = 0, !NAN(*local_260)))))
                        goto LAB_00d3d66d;
                      }
                      if (((bVar3) && ((local_248[1] != 0.0 || (NAN(local_248[1]))))) ||
                         (((bVar4 && ((local_258[1] != 0.0 || (NAN(local_258[1]))))) ||
                          ((uVar6 = 1, bVar5 && ((local_260[1] != 0.0 || (NAN(local_260[1])))))))))
                      {
                        uVar6 = 2;
                      }
                    }
                    else {
                      local_1b8 = (undefined1  [8])0x0;
                      iStack_1b0._M_current = (float **)0x0;
                      local_1a8 = (float **)0x0;
                      if (bVar3) {
                        std::vector<float_const*,std::allocator<float_const*>>::
                        _M_realloc_insert<float_const*const&>
                                  ((vector<float_const*,std::allocator<float_const*>> *)local_1b8,
                                   (iterator)0x0,&local_248);
                      }
                      if (bVar4) {
                        if (iStack_1b0._M_current == local_1a8) {
                          std::vector<float_const*,std::allocator<float_const*>>::
                          _M_realloc_insert<float_const*const&>
                                    ((vector<float_const*,std::allocator<float_const*>> *)local_1b8,
                                     iStack_1b0,&local_258);
                        }
                        else {
                          *iStack_1b0._M_current = local_258;
                          iStack_1b0._M_current = iStack_1b0._M_current + 1;
                        }
                      }
                      if (bVar5) {
                        if (iStack_1b0._M_current == local_1a8) {
                          std::vector<float_const*,std::allocator<float_const*>>::
                          _M_realloc_insert<float_const*const&>
                                    ((vector<float_const*,std::allocator<float_const*>> *)local_1b8,
                                     iStack_1b0,&local_260);
                        }
                        else {
                          *iStack_1b0._M_current = local_260;
                          iStack_1b0._M_current = iStack_1b0._M_current + 1;
                        }
                      }
                      if ((undefined1  [8])iStack_1b0._M_current == local_1b8) {
                        bVar10 = 1;
                        bVar3 = true;
                        bVar4 = true;
                      }
                      else {
                        bVar4 = true;
                        uVar12 = 0;
                        bVar3 = true;
                        bVar10 = 1;
                        do {
                          fVar15 = (float)((TestLog *)((long)local_1b8 + uVar12 * 8))->m_log->flags;
                          fVar16 = fVar15 + -1.0;
                          fVar19 = -fVar16;
                          if (-fVar16 <= fVar16) {
                            fVar19 = fVar16;
                          }
                          bVar11 = 0;
                          if (fVar19 <= 1e-05) {
                            bVar11 = bVar10;
                          }
                          bVar10 = bVar11;
                          fVar19 = *(float *)&((TestLog *)((long)local_1b8 + uVar12 * 8))->m_log->
                                              field_0x4;
                          fVar16 = -fVar19;
                          if (-fVar19 <= fVar19) {
                            fVar16 = fVar19;
                          }
                          if (1e-05 < fVar16) {
                            bVar3 = false;
                          }
                          fVar19 = -fVar15;
                          if (-fVar15 <= fVar15) {
                            fVar19 = fVar15;
                          }
                          if (1e-05 < fVar19) {
                            bVar4 = false;
                          }
                          uVar12 = uVar12 + 1;
                        } while ((uVar12 & 0xffffffff) <
                                 (ulong)((long)iStack_1b0._M_current - (long)local_1b8 >> 3));
                      }
                      bVar5 = bVar3;
                      if ((long)iStack_1b0._M_current - (long)local_1b8 == 8) {
                        fVar15 = (float)(*(qpTestLog **)local_1b8)->flags;
                        fVar19 = *(float *)&(*(qpTestLog **)local_1b8)->field_0x4;
                        fVar16 = -fVar15;
                        if (-fVar15 <= fVar15) {
                          fVar16 = fVar15;
                        }
                        fVar15 = fVar15 + -1.0;
                        fVar17 = -fVar19;
                        if (-fVar19 <= fVar19) {
                          fVar17 = fVar19;
                        }
                        if ((1e-05 <= fVar16) || (1e-05 <= fVar17)) {
                          fVar19 = fVar19 + -1.0;
                          fVar18 = -fVar19;
                          if (-fVar19 <= fVar19) {
                            fVar18 = fVar19;
                          }
                          if ((1e-05 <= fVar16) || (1e-05 <= fVar18)) {
                            fVar19 = -fVar15;
                            if (-fVar15 <= fVar15) {
                              fVar19 = fVar15;
                            }
                            bVar5 = false;
                            if (1e-05 <= fVar17) {
                              bVar5 = bVar3;
                            }
                            if (1e-05 <= fVar19) {
                              bVar5 = bVar3;
                            }
                            bVar11 = 0;
                            if (1e-05 <= fVar18) {
                              bVar11 = bVar10;
                            }
                            if (fVar19 < 1e-05 && 1e-05 <= fVar17) {
                              bVar10 = bVar11;
                              bVar5 = bVar3;
                            }
                          }
                        }
                        else {
                          bVar4 = false;
                        }
                      }
                      uVar6 = 0;
                      if ((!bVar4) && (uVar6 = 1, !bVar5)) {
                        uVar6 = bVar10 ^ 3;
                      }
                      if (local_1b8 != (undefined1  [8])0x0) {
                        operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
                      }
                    }
LAB_00d3d66d:
                    primitive_mode = local_23c;
                    if (uVar6 != *(uint *)(local_1f0 + 0x24)) {
                      uVar6 = *(uint *)(local_1f0 + 0x28);
                      if (uVar6 < 3) {
LAB_00d3d79b:
                        local_1c0 = "quads";
                        if ((int)local_230 == 0) {
                          local_1c0 = "triangles";
                        }
                        local_1b8 = (undefined1  [8])
                                    ((local_238->super_TessellationShaderInvarianceBaseTest).
                                     super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx)->
                                    m_log;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1b0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&iStack_1b0,"For primitive mode [",0x14);
                        this_01 = tcu::MessageBuilder::operator<<
                                            ((MessageBuilder *)local_1b8,&local_1c0);
                        poVar1 = &this_01->m_str;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] ",
                                   2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                   ", inner tessellation levels:",0x1c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[",1
                                  );
                        std::ostream::_M_insert<double>((double)*local_250);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_250[1]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                   "], outer tessellation levels:",0x1d);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[",1
                                  );
                        std::ostream::_M_insert<double>((double)local_250[2]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_250[3]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_250[4]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_250[5]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                   "], a triangle connecting inner & outer edges:",0x2d);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[",1
                                  );
                        std::ostream::_M_insert<double>((double)*local_248);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_248[1]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_248[2]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]x",
                                   2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[",1
                                  );
                        std::ostream::_M_insert<double>((double)*local_258);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_258[1]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_258[2]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]x",
                                   2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[",1
                                  );
                        std::ostream::_M_insert<double>((double)*local_260);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_260[1]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_260[2]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                   "] was not found for runs using CW and CCW vertex ordering, which is against the extension specification\'s rule 7."
                                   ,0x71);
                        tcu::MessageBuilder::operator<<
                                  (this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1b0);
                        std::ios_base::~ios_base(local_140);
                        this_02 = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (this_02,
                                   "Implementation is not conformant with Tessellation Rule 7",
                                   (char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                                   ,0xc3d);
                        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                      }
                      uVar12 = 0;
                      bVar3 = false;
                      do {
                        bVar4 = TessellationShaderUtils::isTriangleDefined
                                          ((float *)((long)pvVar2 + (uVar12 & 0xffffffff) * 4),
                                           pfVar14);
                        if (bVar4) {
                          bVar3 = true;
                        }
                        bVar5 = ((ulong)uVar6 / 3) * 9 - 9 != uVar12;
                        uVar12 = uVar12 + 9;
                      } while (bVar5 && !bVar4);
                      primitive_mode = local_23c;
                      if (!bVar3) goto LAB_00d3d79b;
                    }
                  }
                  uVar12 = local_1c8 + 1;
                  pfVar14 = local_250;
                } while (uVar12 < (ulong)(uint)local_250[10] / 3);
              }
              local_208 = local_208 + 1;
            } while (local_208 !=
                     local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          }
        }
        if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_200 = (ulong)((int)local_200 + 1);
        lVar13 = *(long *)((long)&(local_238->super_TessellationShaderInvarianceBaseTest).
                                  super_TestCaseBase.super_TestCase.super_TestNode._vptr_TestNode +
                          local_1f8);
        uVar12 = (*(long *)((long)&(local_238->super_TessellationShaderInvarianceBaseTest).
                                   super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx +
                           local_1f8) - lVar13 >> 2) * 0x2e8ba2e8ba2e8ba3;
        this = local_238;
      } while (local_200 <= uVar12 && uVar12 - local_200 != 0);
    }
    iVar9 = (int)local_230;
    local_230 = (ulong)(iVar9 + 1);
    if (iVar9 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule7Test::verifyResultData(const void** all_iterations_data)
{
	const float epsilon = 1e-5f;

	/* Run two separate iterations:
	 *
	 * a) triangles
	 * b) quads
	 */
	for (unsigned int n_iteration = 0; n_iteration < 2 /* triangles, quads */; ++n_iteration)
	{
		bool			   is_triangles_iteration = (n_iteration == 0);
		const unsigned int n_base_iteration =
			(n_iteration == 0) ? 0 : (const unsigned int)m_test_triangles_iterations.size();
		const unsigned int n_relevant_outer_tess_levels = (is_triangles_iteration) ? 3 : 4;

		_tessellation_primitive_mode primitive_mode = (n_iteration == 0) ?
														  TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES :
														  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;

		const _test_iterations& test_iterations =
			(n_iteration == 0) ? m_test_triangles_iterations : m_test_quads_iterations;

		DE_ASSERT(test_iterations.size() != 0);

		/* Find a base iteration first */
		for (unsigned int n_base_test_iteration = 0; n_base_test_iteration < test_iterations.size();
			 n_base_test_iteration++)
		{
			const _test_iteration& base_iteration = test_iterations[n_base_test_iteration];
			std::vector<int>	   ref_iteration_indices;

			if (!base_iteration.is_base_iteration)
			{
				continue;
			}

			/* Retrieve reference test iterations */
			for (unsigned int n_reference_iteration = 0; n_reference_iteration < n_relevant_outer_tess_levels;
				 ++n_reference_iteration)
			{
				const unsigned int n_modified_outer_tess_level =
					(base_iteration.n_modified_outer_tess_level + n_reference_iteration + 1) %
					n_relevant_outer_tess_levels;
				const unsigned int ref_iteration_index = getTestIterationIndex(
					is_triangles_iteration, base_iteration.inner_tess_levels, base_iteration.outer_tess_levels,
					base_iteration.vertex_ordering, n_modified_outer_tess_level);

				DE_ASSERT(ref_iteration_index != 0xFFFFFFFF);
				DE_ASSERT(ref_iteration_index != n_base_test_iteration);

				ref_iteration_indices.push_back(ref_iteration_index);
			}

			/* We can now start comparing base data with the information generated for
			 * reference iterations. */
			for (std::vector<int>::const_iterator ref_iteration_iterator = ref_iteration_indices.begin();
				 ref_iteration_iterator != ref_iteration_indices.end(); ref_iteration_iterator++)
			{
				const int&			   n_ref_test_iteration = *ref_iteration_iterator;
				const _test_iteration& ref_iteration		= test_iterations[n_ref_test_iteration];

				/* Now move through all triangles generated for base test iteration. Focus on the ones
				 * that connect the outer edge with one of the inner ones */
				const float* base_iteration_vertex_data =
					(const float*)all_iterations_data[n_base_iteration + n_base_test_iteration];
				const float* ref_iteration_vertex_data =
					(const float*)all_iterations_data[n_base_iteration + n_ref_test_iteration];

				for (unsigned int n_base_triangle = 0;
					 n_base_triangle < base_iteration.n_vertices / 3; /* vertices per triangle */
					 ++n_base_triangle)
				{
					const float* base_triangle_data =
						base_iteration_vertex_data + n_base_triangle * 3 /* vertices */ * 3; /* components */

					/* Is that the triangle type we're after? */
					const float* base_triangle_vertex1 = base_triangle_data;
					const float* base_triangle_vertex2 = base_triangle_vertex1 + 3; /* components */
					const float* base_triangle_vertex3 = base_triangle_vertex2 + 3; /* components */
					bool		 is_base_triangle_vertex1_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex1);
					bool is_base_triangle_vertex2_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex2);
					bool is_base_triangle_vertex3_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex3);
					unsigned int n_outer_edge_vertices_found = 0;

					n_outer_edge_vertices_found += (is_base_triangle_vertex1_outer == true);
					n_outer_edge_vertices_found += (is_base_triangle_vertex2_outer == true);
					n_outer_edge_vertices_found += (is_base_triangle_vertex3_outer == true);

					if (n_outer_edge_vertices_found == 0)
					{
						/* This is an inner triangle, not really of our interest */
						continue;
					}

					/* Which outer tessellation level describes the base data edge? */
					unsigned int n_base_tess_level = 0;

					if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
					{
						if ((!is_base_triangle_vertex1_outer ||
							 (is_base_triangle_vertex1_outer && base_triangle_vertex1[0] == 0.0f)) &&
							(!is_base_triangle_vertex2_outer ||
							 (is_base_triangle_vertex2_outer && base_triangle_vertex2[0] == 0.0f)) &&
							(!is_base_triangle_vertex3_outer ||
							 (is_base_triangle_vertex3_outer && base_triangle_vertex3[0] == 0.0f)))
						{
							n_base_tess_level = 0;
						}
						else if ((!is_base_triangle_vertex1_outer ||
								  (is_base_triangle_vertex1_outer && base_triangle_vertex1[1] == 0.0f)) &&
								 (!is_base_triangle_vertex2_outer ||
								  (is_base_triangle_vertex2_outer && base_triangle_vertex2[1] == 0.0f)) &&
								 (!is_base_triangle_vertex3_outer ||
								  (is_base_triangle_vertex3_outer && base_triangle_vertex3[1] == 0.0f)))
						{
							n_base_tess_level = 1;
						}
						else
						{
							DE_ASSERT((!is_base_triangle_vertex1_outer ||
									   (is_base_triangle_vertex1_outer && base_triangle_vertex1[2] == 0.0f)) &&
									  (!is_base_triangle_vertex2_outer ||
									   (is_base_triangle_vertex2_outer && base_triangle_vertex2[2] == 0.0f)) &&
									  (!is_base_triangle_vertex3_outer ||
									   (is_base_triangle_vertex3_outer && base_triangle_vertex3[2] == 0.0f)));

							n_base_tess_level = 2;
						}
					} /* if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) */
					else
					{
						DE_ASSERT(primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS);

						std::size_t				  n_outer_edge_vertices = 0;
						std::vector<const float*> outer_edge_vertices;

						if (is_base_triangle_vertex1_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex1);
						}

						if (is_base_triangle_vertex2_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex2);
						}

						if (is_base_triangle_vertex3_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex3);
						}

						n_outer_edge_vertices = outer_edge_vertices.size();

						DE_ASSERT(n_outer_edge_vertices >= 1 && n_outer_edge_vertices <= 2);

						bool is_top_outer_edge	= true;
						bool is_right_outer_edge  = true;
						bool is_bottom_outer_edge = true;
						bool is_left_outer_edge   = true;

						/* Find which outer edges the vertices don't belong to. If one is in a corner,
						 * the other will clarify to which edge both vertices belong. */
						for (unsigned int n_vertex = 0; n_vertex < n_outer_edge_vertices; ++n_vertex)
						{
							/* Y < 1, not top outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][1] - 1.0f) > epsilon)
							{
								is_top_outer_edge = false;
							}

							/* X < 1, not right outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][0] - 1.0f) > epsilon)
							{
								is_right_outer_edge = false;
							}

							/* Y > 0, not bottom outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][1]) > epsilon)
							{
								is_bottom_outer_edge = false;
							}

							/* X > 0, not left outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][0]) > epsilon)
							{
								is_left_outer_edge = false;
							}
						}

						if (n_outer_edge_vertices == 1)
						{
							/* A single vertex with corner-coordinates belongs to two edges. Choose one */
							bool x_is_0 = de::abs(outer_edge_vertices[0][0]) < epsilon;
							bool x_is_1 = de::abs(outer_edge_vertices[0][0] - 1.0f) < epsilon;
							bool y_is_0 = de::abs(outer_edge_vertices[0][1]) < epsilon;
							bool y_is_1 = de::abs(outer_edge_vertices[0][1] - 1.0f) < epsilon;

							if (x_is_0 && y_is_0)
							{
								/* bottom edge */
								DE_ASSERT(is_left_outer_edge && is_bottom_outer_edge);
								is_left_outer_edge = false;
							}
							else if (x_is_0 && y_is_1)
							{
								/* left edge */
								DE_ASSERT(is_left_outer_edge && is_top_outer_edge);
								is_top_outer_edge = false;
							}
							else if (x_is_1 && y_is_0)
							{
								/* right edge */
								DE_ASSERT(is_right_outer_edge && is_bottom_outer_edge);
								is_bottom_outer_edge = false;
							}
							else if (x_is_1 && y_is_1)
							{
								/* top edge */
								DE_ASSERT(is_right_outer_edge && is_top_outer_edge);
								is_right_outer_edge = false;
							}
							else
							{
								/* Not a corner vertex, only one of the edge-flags is set */
							}
						}

						/* Sanity checks */
						DE_UNREF(is_top_outer_edge);
						DE_ASSERT((is_left_outer_edge && !is_top_outer_edge && !is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && is_top_outer_edge && !is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && !is_top_outer_edge && is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && !is_top_outer_edge && !is_bottom_outer_edge &&
								   is_right_outer_edge));

						/* We have all the data needed to determine which tessellation level describes
						 * subdivision of the edge that the triangle touches */
						if (is_left_outer_edge)
						{
							n_base_tess_level = 0;
						}
						else if (is_bottom_outer_edge)
						{
							n_base_tess_level = 1;
						}
						else if (is_right_outer_edge)
						{
							n_base_tess_level = 2;
						}
						else
						{
							n_base_tess_level = 3;
						}
					}

					/* We shouldn't perform the check if the edge we're processing was described
					 * by a different outer tessellation level in the reference data set */
					if (n_base_tess_level == ref_iteration.n_modified_outer_tess_level)
					{
						continue;
					}

					/* This triangle should be present in both vertex data sets */
					if (!isTriangleDefinedInVertexDataSet(base_triangle_data, ref_iteration_vertex_data,
														  ref_iteration.n_vertices))
					{
						const char* primitive_mode_str = (is_triangles_iteration) ? "triangles" : "quads";

						m_testCtx.getLog()
							<< tcu::TestLog::Message << "For primitive mode [" << primitive_mode_str << "] "
							<< ", inner tessellation levels:"
							<< "[" << base_iteration.inner_tess_levels[0] << ", " << base_iteration.inner_tess_levels[1]
							<< "], outer tessellation levels:"
							<< "[" << base_iteration.outer_tess_levels[0] << ", " << base_iteration.outer_tess_levels[1]
							<< ", " << base_iteration.outer_tess_levels[2] << ", "
							<< base_iteration.outer_tess_levels[3] << "], a triangle connecting inner & outer edges:"
							<< "[" << base_triangle_vertex1[0] << ", " << base_triangle_vertex1[1] << ", "
							<< base_triangle_vertex1[2] << "]x"
							<< "[" << base_triangle_vertex2[0] << ", " << base_triangle_vertex2[1] << ", "
							<< base_triangle_vertex2[2] << "]x"
							<< "[" << base_triangle_vertex3[0] << ", " << base_triangle_vertex3[1] << ", "
							<< base_triangle_vertex3[2] << "] was not found for runs using CW and CCW vertex ordering, "
														   "which is against the extension specification's rule 7."
							<< tcu::TestLog::EndMessage;

						TCU_FAIL("Implementation is not conformant with Tessellation Rule 7");
					}
				} /* for (all triangles generated for base test iteration) */
			}	 /* for (all reference iterations) */
		}		  /* for (all base test iterations) */
	}			  /* for (both primitive types) */
}